

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_container_mark
              (MD_CTX *ctx,uint indent,MD_OFFSET beg,MD_OFFSET *p_end,MD_CONTAINER *p_container)

{
  bool bVar1;
  char *pcVar2;
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  undefined1 *in_R8;
  MD_OFFSET max_end;
  MD_OFFSET off;
  uint local_30;
  uint local_2c;
  int local_4;
  
  if ((in_EDX < *(uint *)(in_RDI + 1)) && (in_ESI < *(uint *)(in_RDI + 0x46))) {
    if (*(char *)(*in_RDI + (ulong)in_EDX) == '>') {
      *in_R8 = 0x3e;
      *(ushort *)(in_R8 + 1) = *(ushort *)(in_R8 + 1) & 0xff00;
      *(ushort *)(in_R8 + 1) = *(ushort *)(in_R8 + 1) & 0xff;
      *(uint *)(in_R8 + 8) = in_ESI;
      *(uint *)(in_R8 + 0xc) = in_ESI + 1;
      *in_RCX = in_EDX + 1;
      local_4 = 1;
    }
    else if (((*(char *)(*in_RDI + (ulong)in_EDX) == '\0') ||
             (pcVar2 = strchr("-+*",(int)*(char *)(*in_RDI + (ulong)in_EDX)), pcVar2 == (char *)0x0)
             ) || (((in_EDX + 1 < *(uint *)(in_RDI + 1) &&
                    (((*(char *)(*in_RDI + (ulong)(in_EDX + 1)) != ' ' &&
                      (*(char *)(*in_RDI + (ulong)(in_EDX + 1)) != '\t')) &&
                     (*(char *)(*in_RDI + (ulong)(in_EDX + 1)) != '\r')))) &&
                   (*(char *)(*in_RDI + (ulong)(in_EDX + 1)) != '\n')))) {
      local_30 = in_EDX + 9;
      if (*(uint *)(in_RDI + 1) < local_30) {
        local_30 = *(uint *)(in_RDI + 1);
      }
      *(undefined4 *)(in_R8 + 4) = 0;
      local_2c = in_EDX;
      while( true ) {
        bVar1 = false;
        if ((local_2c < local_30) && (bVar1 = false, 0x2f < *(byte *)(*in_RDI + (ulong)local_2c))) {
          bVar1 = *(byte *)(*in_RDI + (ulong)local_2c) < 0x3a;
        }
        if (!bVar1) break;
        *(int *)(in_R8 + 4) =
             *(int *)(in_R8 + 4) * 10 + (int)*(char *)(*in_RDI + (ulong)local_2c) + -0x30;
        local_2c = local_2c + 1;
      }
      if ((((in_EDX < local_2c) && (local_2c < *(uint *)(in_RDI + 1))) &&
          ((*(char *)(*in_RDI + (ulong)local_2c) == '.' ||
           (*(char *)(*in_RDI + (ulong)local_2c) == ')')))) &&
         ((((*(uint *)(in_RDI + 1) <= local_2c + 1 ||
            (*(char *)(*in_RDI + (ulong)(local_2c + 1)) == ' ')) ||
           (*(char *)(*in_RDI + (ulong)(local_2c + 1)) == '\t')) ||
          ((*(char *)(*in_RDI + (ulong)(local_2c + 1)) == '\r' ||
           (*(char *)(*in_RDI + (ulong)(local_2c + 1)) == '\n')))))) {
        *in_R8 = *(undefined1 *)(*in_RDI + (ulong)local_2c);
        *(ushort *)(in_R8 + 1) = *(ushort *)(in_R8 + 1) & 0xff00;
        *(ushort *)(in_R8 + 1) = *(ushort *)(in_R8 + 1) & 0xff;
        *(uint *)(in_R8 + 8) = in_ESI;
        *(uint *)(in_R8 + 0xc) = ((in_ESI + local_2c) - in_EDX) + 1;
        *in_RCX = local_2c + 1;
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      *in_R8 = *(undefined1 *)(*in_RDI + (ulong)in_EDX);
      *(ushort *)(in_R8 + 1) = *(ushort *)(in_R8 + 1) & 0xff00;
      *(ushort *)(in_R8 + 1) = *(ushort *)(in_R8 + 1) & 0xff;
      *(uint *)(in_R8 + 8) = in_ESI;
      *(uint *)(in_R8 + 0xc) = in_ESI + 1;
      *in_RCX = in_EDX + 1;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
md_is_container_mark(MD_CTX* ctx, unsigned indent, OFF beg, OFF* p_end, MD_CONTAINER* p_container)
{
    OFF off = beg;
    OFF max_end;

    if(off >= ctx->size  ||  indent >= ctx->code_indent_offset)
        return FALSE;

    /* Check for block quote mark. */
    if(CH(off) == _T('>')) {
        off++;
        p_container->ch = _T('>');
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off;
        return TRUE;
    }

    /* Check for list item bullet mark. */
    if(ISANYOF(off, _T("-+*"))  &&  (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1))) {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off+1;
        return TRUE;
    }

    /* Check for ordered list item marks. */
    max_end = off + 9;
    if(max_end > ctx->size)
        max_end = ctx->size;
    p_container->start = 0;
    while(off < max_end  &&  ISDIGIT(off)) {
        p_container->start = p_container->start * 10 + CH(off) - _T('0');
        off++;
    }
    if(off > beg  &&
       off < ctx->size  &&
       (CH(off) == _T('.') || CH(off) == _T(')'))  &&
       (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1)))
    {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + off - beg + 1;
        *p_end = off+1;
        return TRUE;
    }

    return FALSE;
}